

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O0

void __thiscall AfkProcessor::flow_line(AfkProcessor *this,Params *args)

{
  string local_38;
  Params *local_18;
  Params *args_local;
  AfkProcessor *this_local;
  
  local_18 = args;
  args_local = (Params *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)&this->currentLine_);
  flow::Params::setResult(args,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AfkProcessor::flow_line(flow::Params& args) {
  args.setResult(currentLine_);
}